

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::insert_move(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,Node *keyval)

{
  InfoType IVar1;
  InfoType IVar2;
  size_t insertion_idx;
  bool bVar3;
  long lVar4;
  long lVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>_>
  *this_00;
  InfoType info;
  size_t idx;
  InfoType local_34;
  size_t local_30;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar3 = try_increase_info(this);
    if (!bVar3) {
      throwOverflowError(this);
    }
  }
  local_30 = 0;
  local_34 = 0;
  Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::keyToIdx<std::__cxx11::string&>
            ((Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyval,
             &local_30,&local_34);
  IVar1 = this->mInfoInc;
  lVar5 = local_30 << 6;
  for (; insertion_idx = local_30, IVar2 = local_34, local_34 <= this->mInfo[local_30];
      local_34 = local_34 + IVar1) {
    local_30 = local_30 + 1;
    lVar5 = lVar5 + 0x40;
  }
  if (0xff < (local_34 & 0xff) + IVar1) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar4 = 0;
  for (; this->mInfo[local_30] != '\0'; local_30 = local_30 + 1) {
    lVar4 = lVar4 + -1;
    local_34 = IVar1 + local_34;
  }
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>_>
             *)((long)&(this->mKeyVals->mData).first._M_dataplus._M_p + lVar5);
  if (lVar4 == 0) {
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>_>
    ::pair(this_00,&keyval->mData);
  }
  else {
    shiftUp(this,local_30,insertion_idx);
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>_>
    ::operator=(this_00,&keyval->mData);
  }
  this->mInfo[insertion_idx] = (uint8_t)IVar2;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }